

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pySRUP_Data.cpp
# Opt level: O0

object get_uint8_data(SRUP_MSG_DATA *self)

{
  uint8_t *x;
  SRUP_MSG_DATA *in_RSI;
  uint8_t *rv;
  SRUP_MSG_DATA *self_local;
  
  x = SRUP_MSG_DATA::data_uint8(in_RSI);
  if (x == (uint8_t *)0x0) {
    boost::python::api::object::object((object *)self);
  }
  else {
    boost::python::api::object::object<unsigned_char>((object *)self,x);
  }
  return (object)(object_base)self;
}

Assistant:

boost::python::object get_uint8_data(SRUP_MSG_DATA& self)
{
    uint8_t* rv;
    rv = self.data_uint8();

    if (rv != nullptr)
        return boost::python::object(*rv);
    else
        return boost::python::object();
}